

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::Heap::sweep(Heap *this)

{
  pointer ppHVar1;
  HeapEntity *pHVar2;
  pointer ppHVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  this->lastMark = this->lastMark + '\x01';
  ppHVar3 = (this->entities).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  while( true ) {
    ppHVar1 = (this->entities).
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)ppHVar3 - (long)ppHVar1 >> 3;
    if (uVar4 <= uVar6) break;
    pHVar2 = ppHVar1[uVar6];
    if (pHVar2->mark != this->lastMark) {
      (*pHVar2->_vptr_HeapEntity[1])();
      ppHVar1 = (this->entities).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppHVar3 = (this->entities).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = (long)ppHVar3 - (long)ppHVar1 >> 3;
      if (uVar6 != lVar5 - 1U) {
        ppHVar1[uVar6] = ppHVar1[lVar5 + -1];
        ppHVar3 = (this->entities).
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppHVar3 = ppHVar3 + -1;
      (this->entities).
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppHVar3;
      uVar6 = uVar6 - 1;
    }
    uVar6 = uVar6 + 1;
  }
  this->numEntities = uVar4;
  this->lastNumEntities = uVar4;
  return;
}

Assistant:

void sweep(void)
    {
        lastMark++;
        // Heap shrinks during this loop.  Do not cache entities.size().
        for (unsigned long i = 0; i < entities.size(); ++i) {
            HeapEntity *x = entities[i];
            if (x->mark != lastMark) {
                delete x;
                if (i != entities.size() - 1) {
                    // Swap it with the back.
                    entities[i] = entities[entities.size() - 1];
                }
                entities.pop_back();
                --i;
            }
        }
        lastNumEntities = numEntities = entities.size();
    }